

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void initialize_impute_calc<ImputedData<unsigned_long,double>,PredictionData<double,unsigned_long>>
               (ImputedData<unsigned_long,_double> *imp,
               PredictionData<double,_unsigned_long> *prediction_data,Imputer *imputer,size_t row)

{
  size_t *psVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  int *piVar6;
  pointer pvVar7;
  pointer pdVar8;
  double *pdVar9;
  pointer puVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  unsigned_long uVar17;
  vector<double,_std::allocator<double>_> *this;
  pointer pdVar18;
  size_t col_1;
  value_type_conflict local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  imp->n_missing_sp = 0;
  if (prediction_data->numeric_data == (double *)0x0) {
    pdVar9 = prediction_data->Xr;
    if (pdVar9 == (double *)0x0) goto LAB_0022d231;
    puVar10 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == puVar10) {
      local_38 = &imp->missing_sp;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (local_38,imputer->ncols_numeric);
      pdVar9 = prediction_data->Xr;
      puVar10 = (local_38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
    puVar3 = prediction_data->Xr_ind;
    puVar4 = prediction_data->Xr_indptr;
    for (uVar17 = puVar4[row]; uVar17 < puVar4[row + 1]; uVar17 = uVar17 + 1) {
      if (0x7fefffffffffffff < (ulong)ABS(pdVar9[uVar17])) {
        uVar5 = puVar3[uVar17];
        sVar2 = imp->n_missing_sp;
        imp->n_missing_sp = sVar2 + 1;
        puVar10[sVar2] = uVar5;
      }
    }
    pdVar18 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar18) {
      lVar12 = imp->n_missing_sp << 3;
      for (lVar13 = 0; lVar12 != lVar13; lVar13 = lVar13 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar13) = 0;
      }
      pdVar18 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar13 = 0; lVar12 != lVar13; lVar13 = lVar13 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar13) = 0;
      }
      goto LAB_0022d231;
    }
    local_40 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (&imp->sp_num_sum,imputer->ncols_numeric,&local_40);
    this = &imp->sp_num_weight;
  }
  else {
    pvVar11 = &imp->missing_num;
    if ((imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      local_38 = pvVar11;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar11,imputer->ncols_numeric);
      pvVar11 = local_38;
    }
    psVar1 = &imp->n_missing_num;
    pdVar9 = prediction_data->numeric_data;
    if (prediction_data->is_col_major == false) {
      puVar10 = (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      for (uVar16 = 0; uVar14 = imputer->ncols_numeric, uVar16 < uVar14; uVar16 = uVar16 + 1) {
        if (0x7fefffffffffffff <
            (*(ulong *)((long)pdVar9 + uVar16 * 8 + uVar14 * row * 8) & 0x7fffffffffffffff)) {
          sVar2 = *psVar1;
          *psVar1 = sVar2 + 1;
          puVar10[sVar2] = uVar16;
        }
      }
    }
    else {
      puVar10 = (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      for (uVar16 = 0; uVar14 = imputer->ncols_numeric, uVar16 < uVar14; uVar16 = uVar16 + 1) {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar9[row + prediction_data->nrows * uVar16])) {
          sVar2 = *psVar1;
          *psVar1 = sVar2 + 1;
          puVar10[sVar2] = uVar16;
        }
      }
    }
    pdVar18 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar18) {
      sVar2 = *psVar1;
      for (lVar12 = 0; sVar2 << 3 != lVar12; lVar12 = lVar12 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar12) = 0;
      }
      pdVar18 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar12 = 0; sVar2 << 3 != lVar12; lVar12 = lVar12 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar12) = 0;
      }
      goto LAB_0022d231;
    }
    local_40 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize(&imp->num_sum,uVar14,&local_40);
    this = &imp->num_weight;
  }
  local_40 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize(this,imputer->ncols_numeric,&local_40);
LAB_0022d231:
  if (prediction_data->categ_data != (int *)0x0) {
    pvVar11 = &imp->missing_cat;
    if ((imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar11,imputer->ncols_categ);
    }
    piVar6 = prediction_data->categ_data;
    if (prediction_data->is_col_major == false) {
      puVar10 = (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      for (uVar16 = 0; uVar14 = imputer->ncols_categ, uVar16 < uVar14; uVar16 = uVar16 + 1) {
        if (*(int *)((long)piVar6 + uVar16 * 4 + uVar14 * row * 4) < 0) {
          sVar2 = imp->n_missing_cat;
          imp->n_missing_cat = sVar2 + 1;
          puVar10[sVar2] = uVar16;
        }
      }
    }
    else {
      puVar10 = (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      for (uVar16 = 0; uVar14 = imputer->ncols_categ, uVar16 < uVar14; uVar16 = uVar16 + 1) {
        if (piVar6[row + prediction_data->nrows * uVar16] < 0) {
          sVar2 = imp->n_missing_cat;
          imp->n_missing_cat = sVar2 + 1;
          puVar10[sVar2] = uVar16;
        }
      }
    }
    pdVar18 = (imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar18) {
      local_40 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(&imp->cat_weight,uVar14,&local_40);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(&imp->cat_sum,imputer->ncols_categ);
      lVar12 = 0;
      for (uVar16 = 0; uVar16 < imputer->ncols_categ; uVar16 = uVar16 + 1) {
        local_40 = 0.0;
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((imp->cat_sum).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar12),
                   (long)(imputer->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar16],&local_40);
        lVar12 = lVar12 + 0x18;
      }
    }
    else {
      sVar2 = imp->n_missing_cat;
      for (lVar12 = 0; sVar2 * 8 - lVar12 != 0; lVar12 = lVar12 + 8) {
        *(undefined8 *)((long)pdVar18 + lVar12) = 0;
      }
      pvVar7 = (imp->cat_sum).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (sVar15 = 0; sVar15 != sVar2; sVar15 = sVar15 + 1) {
        uVar17 = puVar10[sVar15];
        pdVar8 = *(pointer *)
                  ((long)&pvVar7[uVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8);
        for (pdVar18 = pvVar7[uVar17].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
          *pdVar18 = 0.0;
        }
      }
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, PredictionData &prediction_data, Imputer &imputer, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (prediction_data.numeric_data != NULL)
    {
        if (!imp.missing_num.size())
            imp.missing_num.resize(imputer.ncols_numeric);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        if (!imp.num_sum.size())
        {
            imp.num_sum.resize(imputer.ncols_numeric,    0);
            imp.num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.num_sum.begin(),     imp.num_sum.begin()    + imp.n_missing_num,  0);
            std::fill(imp.num_weight.begin(),  imp.num_weight.begin() + imp.n_missing_num,  0);
        }
    }

    else if (prediction_data.Xr != NULL)
    {
        if (!imp.missing_sp.size())
            imp.missing_sp.resize(imputer.ncols_numeric);
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            if (is_na_or_inf(prediction_data.Xr[ix]))
                imp.missing_sp[imp.n_missing_sp++] = prediction_data.Xr_ind[ix];

        if (!imp.sp_num_sum.size())
        {
            imp.sp_num_sum.resize(imputer.ncols_numeric,    0);
            imp.sp_num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.sp_num_sum.begin(),     imp.sp_num_sum.begin()    + imp.n_missing_sp,  0);
            std::fill(imp.sp_num_weight.begin(),  imp.sp_num_weight.begin() + imp.n_missing_sp,  0);
        }
    }
    
    if (prediction_data.categ_data != NULL)
    {
        if (!imp.missing_cat.size())
            imp.missing_cat.resize(imputer.ncols_categ);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        if (!imp.cat_weight.size())
        {
            imp.cat_weight.resize(imputer.ncols_categ, 0);
            imp.cat_sum.resize(imputer.ncols_categ);
            for (size_t col = 0; col < imputer.ncols_categ; col++)
                imp.cat_sum[col].resize(imputer.ncat[col], 0);
        }

        else
        {
            std::fill(imp.cat_weight.begin(), imp.cat_weight.begin() + imp.n_missing_cat, 0);
            for (size_t col = 0; col < imp.n_missing_cat; col++)
                std::fill(imp.cat_sum[imp.missing_cat[col]].begin(),
                          imp.cat_sum[imp.missing_cat[col]].end(),
                          0);
        }
    }
}